

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PingResponder.hpp
# Opt level: O0

void __thiscall
ableton::link::
PingResponder<ableton::platforms::asio::AsioService&,ableton::platforms::linux::Clock<1>,ableton::discovery::Socket<512ul>,ableton::util::NullLog>
::Impl::reply<unsigned_char_const*>(Impl *this,uchar *begin,uchar *end,endpoint *to)

{
  microseconds tm;
  iterator out;
  uchar *puVar1;
  void *__buf;
  pointer pvVar2;
  int __flags;
  microseconds in_R8;
  GHostTime entries_1;
  size_t numBytes;
  uchar *pongMsgEnd;
  iterator pongMsgBegin;
  MessageBuffer pongBuffer;
  undefined1 local_80 [8];
  Payload<ableton::link::SessionMembership,_ableton::discovery::Payload<ableton::link::GHostTime,_ableton::discovery::Payload<>_>_>
  pongPayload;
  undefined1 local_40 [8];
  GHostTime currentGt;
  SessionMembership id;
  endpoint *to_local;
  uchar *end_local;
  uchar *begin_local;
  Impl *this_local;
  
  currentGt.time.__r = *(rep *)(this + 0x10);
  pongPayload.mRest._24_8_ = ableton::platforms::linux::Clock<1>::micros((Clock<1> *)(this + 0x28));
  tm = GhostXForm::hostToGhost((GhostXForm *)(this + 0x18),(microseconds)pongPayload.mRest._24_8_);
  GHostTime::GHostTime((GHostTime *)local_40,tm);
  pongBuffer._M_elems[0x1f8] = local_40[0];
  pongBuffer._M_elems[0x1f9] = local_40[1];
  pongBuffer._M_elems[0x1fa] = local_40[2];
  pongBuffer._M_elems[0x1fb] = local_40[3];
  pongBuffer._M_elems[0x1fc] = local_40[4];
  pongBuffer._M_elems[0x1fd] = local_40[5];
  pongBuffer._M_elems[0x1fe] = local_40[6];
  pongBuffer._M_elems[0x1ff] = local_40[7];
  entries_1.time.__r = in_R8.__r;
  entries_1.super_HostTime = (HostTime)(HostTime)currentGt.super_HostTime.time.__r;
  discovery::makePayload<ableton::link::SessionMembership,ableton::link::GHostTime>
            ((Payload<ableton::link::SessionMembership,_ableton::discovery::Payload<ableton::link::GHostTime,_ableton::discovery::Payload<>_>_>
              *)local_80,(discovery *)currentGt.time.__r,(SessionMembership)local_40,entries_1);
  __flags = (int)in_R8.__r;
  out = std::begin<std::array<unsigned_char,512ul>>((array<unsigned_char,_512UL> *)&pongMsgBegin);
  puVar1 = v1::
           pongMessage<ableton::discovery::Payload<ableton::link::SessionMembership,ableton::discovery::Payload<ableton::link::GHostTime,ableton::discovery::Payload<>>>,unsigned_char*>
                     ((Payload<ableton::link::SessionMembership,_ableton::discovery::Payload<ableton::link::GHostTime,_ableton::discovery::Payload<>_>_>
                       *)local_80,out);
  puVar1 = std::copy<unsigned_char_const*,unsigned_char*>(begin,end,puVar1);
  __buf = (void *)std::distance<unsigned_char*>(out,puVar1);
  pvVar2 = std::array<unsigned_char,_512UL>::data((array<unsigned_char,_512UL> *)&pongMsgBegin);
  discovery::Socket<512UL>::send
            ((Socket<512UL> *)(this + 0x30),(int)pvVar2,__buf,(size_t)to,__flags);
  return;
}

Assistant:

void reply(It begin, It end, const asio::ip::udp::endpoint& to)
    {
      using namespace discovery;

      // Encode Pong Message
      const auto id = SessionMembership{mSessionId};
      const auto currentGt = GHostTime{mGhostXForm.hostToGhost(mClock.micros())};
      const auto pongPayload = makePayload(id, currentGt);

      v1::MessageBuffer pongBuffer;
      const auto pongMsgBegin = std::begin(pongBuffer);
      auto pongMsgEnd = v1::pongMessage(pongPayload, pongMsgBegin);
      // Append ping payload to pong message.
      pongMsgEnd = std::copy(begin, end, pongMsgEnd);

      const auto numBytes =
        static_cast<std::size_t>(std::distance(pongMsgBegin, pongMsgEnd));
      mSocket.send(pongBuffer.data(), numBytes, to);
    }